

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int ARKodeEvolve(void *arkode_mem,sunrealtype tout,N_Vector yout,sunrealtype *tret,int itask)

{
  int *nflagPtr;
  double t;
  long lVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int error_code;
  ulong uVar6;
  char *pcVar7;
  bool bVar8;
  double dVar9;
  sunrealtype sVar10;
  undefined8 uVar11;
  double dVar12;
  double dVar13;
  sunrealtype dsm;
  int relax_fails;
  int constrfails;
  int nef;
  int ncf;
  int nflag;
  int local_68;
  int local_64;
  sunrealtype local_60;
  sunrealtype local_58;
  int local_4c [5];
  long local_38;
  
  if (arkode_mem == (void *)0x0) {
    pcVar7 = "arkode_mem = NULL illegal.";
    iVar5 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar3 = 0x2a3;
  }
  else if (*(int *)((long)arkode_mem + 0x3c0) == 0) {
    pcVar7 = "Attempt to call before ARKodeInit.";
    iVar5 = -0x17;
    error_code = -0x17;
    iVar3 = 0x2ac;
  }
  else {
    *(N_Vector *)((long)arkode_mem + 0x248) = yout;
    if (yout == (N_Vector)0x0) {
      pcVar7 = "yout = NULL illegal.";
      iVar5 = -0x16;
      error_code = -0x16;
      iVar3 = 0x2b4;
    }
    else if (tret == (sunrealtype *)0x0) {
      pcVar7 = "tret = NULL illegal.";
      iVar5 = -0x16;
      error_code = -0x16;
      iVar3 = 700;
    }
    else {
      if (0xfffffffd < itask - 3U) {
        lVar1 = *(long *)((long)arkode_mem + 0x3d8);
        if (lVar1 != 0) {
          if (itask == 1) {
            *(sunrealtype *)(lVar1 + 0x50) = tout;
          }
          *(int *)(lVar1 + 0x60) = itask;
        }
        local_60 = tout;
        if (*(int *)((long)arkode_mem + 0x3c4) != 0) {
          sVar10 = *(sunrealtype *)((long)arkode_mem + 0x2f0);
          *tret = sVar10;
          *(sunrealtype *)((long)arkode_mem + 0x2f8) = sVar10;
          local_68 = arkInitialSetup((ARKodeMem)arkode_mem,tout);
          if (local_68 != 0) {
            return local_68;
          }
        }
        if ((*(int *)((long)arkode_mem + 0x3c4) == 0) &&
           (iVar3 = arkStopTests((ARKodeMem)arkode_mem,local_60,yout,tret,itask,&local_68),
           iVar3 != 0)) {
          return local_68;
        }
        nflagPtr = local_4c + 4;
        local_38 = 0;
        local_64 = local_68;
        do {
          *(undefined8 *)((long)arkode_mem + 0x2e0) = *(undefined8 *)((long)arkode_mem + 0x2c0);
          if (*(int *)((long)arkode_mem + 0x3c4) == 0) {
            iVar3 = (**(code **)((long)arkode_mem + 0x58))
                              (*(undefined8 *)((long)arkode_mem + 0x250),
                               *(undefined8 *)((long)arkode_mem + 0x230),
                               *(undefined8 *)((long)arkode_mem + 0x60));
            if (iVar3 != 0) {
              uVar11 = *(undefined8 *)((long)arkode_mem + 0x2f0);
              if (*(int *)((long)arkode_mem + 0x18) == 2) {
                pcVar7 = "At t = %.15g, the user-provide EwtSet function failed.";
                iVar3 = 0x310;
              }
              else {
                pcVar7 = "At t = %.15g, a component of ewt has become <= 0.";
                iVar3 = 0x315;
              }
LAB_001652de:
              local_68 = local_64;
              arkProcessError((ARKodeMem)arkode_mem,-0x16,iVar3,"ARKodeEvolve",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                              ,pcVar7,uVar11);
              sVar10 = *(sunrealtype *)((long)arkode_mem + 0x2f0);
              *tret = sVar10;
              *(sunrealtype *)((long)arkode_mem + 0x2f8) = sVar10;
              N_VScale(0x3ff0000000000000,*(undefined8 *)((long)arkode_mem + 0x250),yout);
              return -0x16;
            }
            if ((*(int *)((long)arkode_mem + 0x240) == 0) &&
               (iVar3 = (**(code **)((long)arkode_mem + 0x70))
                                  (*(undefined8 *)((long)arkode_mem + 0x250),
                                   *(undefined8 *)((long)arkode_mem + 0x238),
                                   *(undefined8 *)((long)arkode_mem + 0x78)), iVar3 != 0)) {
              uVar11 = *(undefined8 *)((long)arkode_mem + 0x2f0);
              if (*(int *)((long)arkode_mem + 0x18) == 2) {
                pcVar7 = "At t = %.15g, the user-provide RwtSet function failed.";
                iVar3 = 0x326;
              }
              else {
                pcVar7 = "At t = %.15g, a component of rwt has become <= 0.";
                iVar3 = 0x32b;
              }
              goto LAB_001652de;
            }
          }
          if (*(long *)((long)arkode_mem + 0x310) <= local_38 &&
              0 < *(long *)((long)arkode_mem + 0x310)) {
            local_68 = local_64;
            iVar3 = -1;
            arkProcessError((ARKodeMem)arkode_mem,-1,0x33a,"ARKodeEvolve",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                            ,"At t = %.15g, mxstep steps taken before reaching tout.",
                            *(undefined8 *)((long)arkode_mem + 0x2f0));
LAB_00164fdb:
            sVar10 = *(sunrealtype *)((long)arkode_mem + 0x2f0);
            *tret = sVar10;
            *(sunrealtype *)((long)arkode_mem + 0x2f8) = sVar10;
            N_VScale(0x3ff0000000000000,*(undefined8 *)((long)arkode_mem + 0x250),yout);
            return iVar3;
          }
          dVar9 = (double)N_VWrmsNorm(*(undefined8 *)((long)arkode_mem + 0x250),
                                      *(undefined8 *)((long)arkode_mem + 0x230));
          dVar9 = dVar9 * *(double *)((long)arkode_mem + 8);
          *(double *)((long)arkode_mem + 0x398) = dVar9;
          if ((1.0 < dVar9) && (*(int *)((long)arkode_mem + 0x300) == 0)) {
            local_68 = local_64;
            arkProcessError((ARKodeMem)arkode_mem,-2,0x347,"ARKodeEvolve",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                            ,"At t = %.15g, too much accuracy requested.",
                            *(undefined8 *)((long)arkode_mem + 0x2f0));
            sVar10 = *(sunrealtype *)((long)arkode_mem + 0x2f0);
            *tret = sVar10;
            *(sunrealtype *)((long)arkode_mem + 0x2f8) = sVar10;
            N_VScale(0x3ff0000000000000,*(undefined8 *)((long)arkode_mem + 0x250),yout);
            *(double *)((long)arkode_mem + 0x398) =
                 *(double *)((long)arkode_mem + 0x398) + *(double *)((long)arkode_mem + 0x398);
            return -2;
          }
          *(undefined8 *)((long)arkode_mem + 0x398) = 0x3ff0000000000000;
          dVar9 = *(double *)((long)arkode_mem + 0x2f0);
          dVar12 = dVar9 + *(double *)((long)arkode_mem + 0x2c0);
          if ((dVar12 == dVar9) && (!NAN(dVar12) && !NAN(dVar9))) {
            iVar3 = *(int *)((long)arkode_mem + 0x338);
            *(int *)((long)arkode_mem + 0x338) = iVar3 + 1;
            if (iVar3 < *(int *)((long)arkode_mem + 0x318)) {
              arkProcessError((ARKodeMem)arkode_mem,99,0x357,"ARKodeEvolve",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                              ,
                              "Internal t = %.15g and h = %.15g are such that t + h = t on the next step. The solver will continue anyway."
                             );
            }
            if (*(int *)((long)arkode_mem + 0x338) == *(int *)((long)arkode_mem + 0x318)) {
              arkProcessError((ARKodeMem)arkode_mem,99,0x35c,"ARKodeEvolve",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                              ,
                              "The above warning has been issued mxhnil times and will not be issued again for this problem."
                             );
            }
          }
          dVar9 = *(double *)((long)arkode_mem + 0x2c0);
          if ((*(double *)((long)arkode_mem + 0x2d8) != dVar9) ||
             (NAN(*(double *)((long)arkode_mem + 0x2d8)) || NAN(dVar9))) {
            dVar9 = dVar9 * *(double *)((long)arkode_mem + 0x2e8);
            *(double *)((long)arkode_mem + 0x2c0) = dVar9;
            *(double *)((long)arkode_mem + 0x2e0) = dVar9;
          }
          if (*(int *)((long)arkode_mem + 0x300) != 0) {
            dVar9 = *(double *)((long)arkode_mem + 0x2b8);
            *(double *)((long)arkode_mem + 0x2c0) = dVar9;
            *(double *)((long)arkode_mem + 0x2e0) = dVar9;
            if (*(int *)((long)arkode_mem + 0x2a8) != 0) {
              if (0.0 < ((dVar9 + *(double *)((long)arkode_mem + 0x2f0)) -
                        *(double *)((long)arkode_mem + 0x2b0)) * dVar9) {
                *(double *)((long)arkode_mem + 0x2c0) =
                     (*(double *)((long)arkode_mem + 8) * -4.0 + 1.0) *
                     (*(double *)((long)arkode_mem + 0x2b0) - *(double *)((long)arkode_mem + 0x2f0))
                ;
              }
            }
          }
          local_58 = 0.0;
          iVar3 = 0;
          *(undefined4 *)((long)arkode_mem + 0x43c) = 0;
          local_4c[1] = 0;
          local_4c[2] = 0;
          local_4c[3] = 0;
          local_4c[0] = 0;
          local_4c[4] = 6;
          while( true ) {
            if (iVar3 != 0xb) {
              *(long *)((long)arkode_mem + 0x328) = *(long *)((long)arkode_mem + 0x328) + 1;
            }
            iVar3 = (**(code **)((long)arkode_mem + 0xa0))(arkode_mem,&local_58,nflagPtr);
            if (iVar3 < 0) goto LAB_00164d30;
            iVar3 = arkCheckConvergence((ARKodeMem)arkode_mem,nflagPtr,local_4c + 3);
            if (((iVar3 < 0) ||
                (((iVar3 == 0 && (*(int *)((long)arkode_mem + 0x3e0) != 0)) &&
                 (iVar3 = arkRelax((ARKodeMem)arkode_mem,local_4c,&local_58), iVar3 < 0)))) ||
               (((iVar3 == 0 && (*(int *)((long)arkode_mem + 0x80) != 0)) &&
                (iVar3 = arkCheckConstraints((ARKodeMem)arkode_mem,local_4c + 1,nflagPtr), iVar3 < 0
                )))) goto LAB_00164d30;
            if (*(int *)((long)arkode_mem + 0x300) != 0) {
              *(undefined8 *)((long)arkode_mem + 0x2e8) = 0x3ff0000000000000;
              goto LAB_00164d30;
            }
            if ((iVar3 == 0) &&
               (iVar3 = arkCheckTemporalError((ARKodeMem)arkode_mem,nflagPtr,local_4c + 2,local_58),
               iVar3 < 0)) goto LAB_00164d30;
            if (*(int *)((long)arkode_mem + 0x438) != 0) break;
            if (iVar3 == 0) goto LAB_00164d2e;
            if (ABS(*(double *)((long)arkode_mem + 0x2c0)) <=
                *(double *)((long)arkode_mem + 0x2c8) * 1.000001) {
              return -3;
            }
            dVar9 = *(double *)((long)arkode_mem + 0x2c0) * *(double *)((long)arkode_mem + 0x2e8);
            *(double *)((long)arkode_mem + 0x2c0) = dVar9;
            *(double *)((long)arkode_mem + 0x2d8) = dVar9;
            *(double *)((long)arkode_mem + 0x2e0) = dVar9;
          }
          *(int *)((long)arkode_mem + 0x43c) = iVar3;
LAB_00164d2e:
          iVar3 = 0;
LAB_00164d30:
          if (iVar3 == 0) {
            iVar3 = arkCompleteStep((ARKodeMem)arkode_mem,local_58);
          }
          if (iVar3 != 0) {
            local_68 = local_64;
            iVar3 = arkHandleFailure((ARKodeMem)arkode_mem,iVar3);
            goto LAB_00164fdb;
          }
          if ((*(long *)((long)arkode_mem + 0x3d8) != 0) &&
             (0 < *(int *)(*(long *)((long)arkode_mem + 0x3d8) + 8))) {
            iVar3 = arkRootCheck3(arkode_mem);
            if (iVar3 == -0xc) {
              sVar10 = *(sunrealtype *)(*(long *)((long)arkode_mem + 0x3d8) + 0x20);
              pcVar7 = "At t = %.15g, the rootfinding routine failed in an unrecoverable manner.";
              iVar3 = 0x410;
              local_68 = -0xc;
              goto LAB_0016518c;
            }
            if (iVar3 == 1) {
              lVar1 = *(long *)((long)arkode_mem + 0x3d8);
              *(undefined4 *)(lVar1 + 100) = 1;
              sVar10 = *(sunrealtype *)(lVar1 + 0x20);
              *tret = sVar10;
              *(sunrealtype *)((long)arkode_mem + 0x2f8) = sVar10;
              return 2;
            }
            local_64 = iVar3;
            if (*(long *)((long)arkode_mem + 0x330) == 1) {
              lVar1 = *(long *)((long)arkode_mem + 0x3d8);
              uVar4 = (ulong)*(int *)(lVar1 + 8);
              bVar8 = 0 < (long)uVar4;
              if ((0 < (long)uVar4) && (**(int **)(lVar1 + 0x70) != 0)) {
                uVar2 = 1;
                do {
                  uVar6 = uVar2;
                  if (uVar4 == uVar6) break;
                  uVar2 = uVar6 + 1;
                } while ((*(int **)(lVar1 + 0x70))[uVar6] != 0);
                bVar8 = uVar6 < uVar4;
              }
              if ((bVar8) && (0 < *(int *)(lVar1 + 0x78))) {
                arkProcessError((ARKodeMem)arkode_mem,99,0x427,"ARKodeEvolve",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                ,
                                "At the end of the first step, there are still some root functions identically 0. This warning will not be issued again."
                               );
              }
            }
          }
          if (*(int *)((long)arkode_mem + 0x2a8) != 0) {
            dVar9 = *(double *)((long)arkode_mem + 0x2f0);
            dVar12 = *(double *)((long)arkode_mem + 0x2c0);
            dVar13 = (ABS(dVar12) + ABS(dVar9)) * *(double *)((long)arkode_mem + 8) * 100.0;
            t = *(double *)((long)arkode_mem + 0x2b0);
            if (ABS(dVar9 - t) <= dVar13) {
              if ((0.0 <= dVar12 * (local_60 - t)) || (ABS(local_60 - t) <= dVar13)) {
                local_68 = local_64;
                if ((*(int *)((long)arkode_mem + 0x2ac) == 0) ||
                   (*(long *)((long)arkode_mem + 0x298) == 0)) {
                  N_VScale(0x3ff0000000000000,*(undefined8 *)((long)arkode_mem + 0x250),yout);
LAB_0016521d:
                  sVar10 = *(sunrealtype *)((long)arkode_mem + 0x2b0);
                  *tret = sVar10;
                  *(sunrealtype *)((long)arkode_mem + 0x2f8) = sVar10;
                  *(undefined4 *)((long)arkode_mem + 0x2a8) = 0;
                  return 1;
                }
                local_68 = ARKodeGetDky(arkode_mem,t,0,yout);
                if (local_68 == 0) goto LAB_0016521d;
                sVar10 = *(sunrealtype *)((long)arkode_mem + 0x2b0);
                pcVar7 = "At t = %.15g, interpolating the solution failed.";
                iVar3 = 0x43f;
                goto LAB_0016518c;
              }
            }
            else if (0.0 < ((*(double *)((long)arkode_mem + 0x2d8) + dVar9) - t) * dVar12) {
              dVar9 = (*(double *)((long)arkode_mem + 8) * -4.0 + 1.0) * (t - dVar9);
              *(double *)((long)arkode_mem + 0x2d8) = dVar9;
              *(double *)((long)arkode_mem + 0x2e8) = dVar9 / dVar12;
            }
          }
          local_38 = local_38 + 1;
          if ((itask == 1) &&
             (0.0 <= (*(double *)((long)arkode_mem + 0x2f0) - local_60) *
                     *(double *)((long)arkode_mem + 0x2c0))) {
            local_68 = local_64;
            if (*(long *)((long)arkode_mem + 0x298) == 0) {
              N_VScale(0x3ff0000000000000,*(undefined8 *)((long)arkode_mem + 0x250),yout);
              local_60 = *(sunrealtype *)((long)arkode_mem + 0x2f0);
            }
            else {
              local_68 = ARKodeGetDky(arkode_mem,local_60,0,yout);
              if (local_68 != 0) {
                pcVar7 = "At t = %.15g, interpolating the solution failed.";
                iVar3 = 0x45e;
                sVar10 = local_60;
LAB_0016518c:
                iVar5 = local_68;
                arkProcessError((ARKodeMem)arkode_mem,local_68,iVar3,"ARKodeEvolve",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                ,pcVar7,sVar10);
                return iVar5;
              }
            }
            *tret = local_60;
            *(sunrealtype *)((long)arkode_mem + 0x2f8) = local_60;
            goto LAB_001652b3;
          }
          if (itask == 2) {
            local_68 = local_64;
            sVar10 = *(sunrealtype *)((long)arkode_mem + 0x2f0);
            *tret = sVar10;
            *(sunrealtype *)((long)arkode_mem + 0x2f8) = sVar10;
            N_VScale(0x3ff0000000000000,*(undefined8 *)((long)arkode_mem + 0x250),yout);
LAB_001652b3:
            *(undefined8 *)((long)arkode_mem + 0x2e0) = *(undefined8 *)((long)arkode_mem + 0x2d8);
            return 0;
          }
        } while( true );
      }
      pcVar7 = "Illegal value for itask.";
      iVar5 = -0x16;
      error_code = -0x16;
      iVar3 = 0x2c4;
    }
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar3,"ARKodeEvolve",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                  ,pcVar7);
  return iVar5;
}

Assistant:

int ARKodeEvolve(void* arkode_mem, sunrealtype tout, N_Vector yout,
                 sunrealtype* tret, int itask)
{
  long int nstloc;
  int retval, kflag, istate, ir;
  int ewtsetOK;
  sunrealtype troundoff, nrm;
  sunbooleantype inactive_roots;
  sunrealtype dsm;
  int nflag, ncf, nef, constrfails;
  int relax_fails;
  ARKodeMem ark_mem;

  /* used only with debugging logging */
  SUNDIALS_MAYBE_UNUSED int attempts;

  /* Check and process inputs */

  /* Check if ark_mem exists */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return (ARK_NO_MALLOC);
  }

  /* Check for yout != NULL */
  if ((ark_mem->ycur = yout) == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_YOUT_NULL);
    return (ARK_ILL_INPUT);
  }

  /* Check for tret != NULL */
  if (tret == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_TRET_NULL);
    return (ARK_ILL_INPUT);
  }

  /* Check for valid itask */
  if ((itask != ARK_NORMAL) && (itask != ARK_ONE_STEP))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_ITASK);
    return (ARK_ILL_INPUT);
  }

  /* start profiler */
  SUNDIALS_MARK_FUNCTION_BEGIN(ARK_PROFILER);

  /* store copy of itask if using root-finding */
  if (ark_mem->root_mem != NULL)
  {
    if (itask == ARK_NORMAL) { ark_mem->root_mem->toutc = tout; }
    ark_mem->root_mem->taskc = itask;
  }

  /* perform first-step-specific initializations:
     - initialize tret values to initialization time
     - perform initial integrator setup  */
  if (ark_mem->initsetup)
  {
    ark_mem->tretlast = *tret = ark_mem->tcur;
    retval                    = arkInitialSetup(ark_mem, tout);
    if (retval != ARK_SUCCESS)
    {
      SUNDIALS_MARK_FUNCTION_END(ARK_PROFILER);
      return (retval);
    }
  }

  /* perform stopping tests */
  if (!ark_mem->initsetup)
  {
    if (arkStopTests(ark_mem, tout, yout, tret, itask, &retval))
    {
      SUNDIALS_MARK_FUNCTION_END(ARK_PROFILER);
      return (retval);
    }
  }

  /*--------------------------------------------------
    Looping point for successful internal steps

    - update the ewt/rwt vectors for upcoming step
    - check for errors (too many steps, too much
      accuracy requested, step size too small)
    - loop over attempts at a new step:
      * try to take step (via time stepper module),
        handle solver convergence or other failures
      * if the stepper requests ARK_RETRY_STEP, we
        retry the step without accumulating failures.
        A stepper should never request this multiple
        times in a row.
      * perform constraint-handling (if selected)
      * check temporal error
      * if all of the above pass, complete step by
        updating current time, solution, error &
        stepsize history arrays.
    - perform stop tests:
      * check for root in last step taken
      * check if tout was passed
      * check if close to tstop
      * check if in ONE_STEP mode (must return)
    --------------------------------------------------*/
  nstloc = 0;
  for (;;)
  {
    ark_mem->next_h = ark_mem->h;

    /* Reset and check ewt and rwt */
    if (!ark_mem->initsetup)
    {
      ewtsetOK = ark_mem->efun(ark_mem->yn, ark_mem->ewt, ark_mem->e_data);
      if (ewtsetOK != 0)
      {
        if (ark_mem->itol == ARK_WF)
        {
          arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                          MSG_ARK_EWT_NOW_FAIL, ark_mem->tcur);
        }
        else
        {
          arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                          MSG_ARK_EWT_NOW_BAD, ark_mem->tcur);
        }

        istate            = ARK_ILL_INPUT;
        ark_mem->tretlast = *tret = ark_mem->tcur;
        N_VScale(ONE, ark_mem->yn, yout);
        break;
      }

      if (!ark_mem->rwt_is_ewt)
      {
        ewtsetOK = ark_mem->rfun(ark_mem->yn, ark_mem->rwt, ark_mem->r_data);
        if (ewtsetOK != 0)
        {
          if (ark_mem->itol == ARK_WF)
          {
            arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                            __FILE__, MSG_ARK_RWT_NOW_FAIL, ark_mem->tcur);
          }
          else
          {
            arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                            __FILE__, MSG_ARK_RWT_NOW_BAD, ark_mem->tcur);
          }

          istate            = ARK_ILL_INPUT;
          ark_mem->tretlast = *tret = ark_mem->tcur;
          N_VScale(ONE, ark_mem->yn, yout);
          break;
        }
      }
    }

    /* Check for too many steps */
    if ((ark_mem->mxstep > 0) && (nstloc >= ark_mem->mxstep))
    {
      arkProcessError(ark_mem, ARK_TOO_MUCH_WORK, __LINE__, __func__, __FILE__,
                      MSG_ARK_MAX_STEPS, ark_mem->tcur);
      istate            = ARK_TOO_MUCH_WORK;
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      break;
    }

    /* Check for too much accuracy requested */
    nrm            = N_VWrmsNorm(ark_mem->yn, ark_mem->ewt);
    ark_mem->tolsf = ark_mem->uround * nrm;
    if (ark_mem->tolsf > ONE && !ark_mem->fixedstep)
    {
      arkProcessError(ark_mem, ARK_TOO_MUCH_ACC, __LINE__, __func__, __FILE__,
                      MSG_ARK_TOO_MUCH_ACC, ark_mem->tcur);
      istate            = ARK_TOO_MUCH_ACC;
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      ark_mem->tolsf *= TWO;
      break;
    }
    else { ark_mem->tolsf = ONE; }

    /* Check for h below roundoff level in tn */
    if (ark_mem->tcur + ark_mem->h == ark_mem->tcur)
    {
      ark_mem->nhnil++;
      if (ark_mem->nhnil <= ark_mem->mxhnil)
      {
        arkProcessError(ark_mem, ARK_WARNING, __LINE__, __func__, __FILE__,
                        MSG_ARK_HNIL, ark_mem->tcur, ark_mem->h);
      }
      if (ark_mem->nhnil == ark_mem->mxhnil)
      {
        arkProcessError(ark_mem, ARK_WARNING, __LINE__, __func__, __FILE__,
                        MSG_ARK_HNIL_DONE);
      }
    }

    /* Update parameter for upcoming step size */
    if (ark_mem->hprime != ark_mem->h)
    {
      ark_mem->h      = ark_mem->h * ark_mem->eta;
      ark_mem->next_h = ark_mem->h;
    }
    if (ark_mem->fixedstep)
    {
      ark_mem->h      = ark_mem->hin;
      ark_mem->next_h = ark_mem->h;

      /* patch for 'fixedstep' + 'tstop' use case:
         limit fixed step size if step would overtake tstop */
      if (ark_mem->tstopset)
      {
        if ((ark_mem->tcur + ark_mem->h - ark_mem->tstop) * ark_mem->h > ZERO)
        {
          ark_mem->h = (ark_mem->tstop - ark_mem->tcur) *
                       (ONE - FOUR * ark_mem->uround);
        }
      }
    }

    /* Looping point for step attempts */
    dsm      = ZERO;
    kflag    = ARK_SUCCESS;
    attempts = ncf = nef = constrfails = ark_mem->last_kflag = 0;
    relax_fails                                              = 0;
    nflag                                                    = FIRST_CALL;
    for (;;)
    {
      /* increment attempt counters
         Note: kflag can only equal ARK_RETRY_STEP if the stepper rejected
         the current step size before performing calculations. Thus, we do
         not include those when keeping track of step "attempts". */
      if (kflag != ARK_RETRY_STEP)
      {
        attempts++;
        ark_mem->nst_attempts++;
      }

      SUNLogInfo(ARK_LOGGER, "begin-step-attempt",
                 "step = %li, tn = " SUN_FORMAT_G ", h = " SUN_FORMAT_G,
                 ark_mem->nst + 1, ark_mem->tn, ark_mem->h);

      /* Call time stepper module to attempt a step:
            0 => step completed successfully
           >0 => step encountered recoverable failure; reduce step if possible
           <0 => step encountered unrecoverable failure */
      kflag = ark_mem->step((void*)ark_mem, &dsm, &nflag);
      if (kflag < 0)
      {
        /* Log fatal errors here, other returns handled below */
        SUNLogInfo(ARK_LOGGER, "end-step-attempt",
                   "status = failed step, kflag = %i", kflag);
        break;
      }

      /* handle solver convergence failures */
      kflag = arkCheckConvergence(ark_mem, &nflag, &ncf);

      SUNLogInfoIf(kflag != ARK_SUCCESS, ARK_LOGGER, "end-step-attempt",
                   "status = failed step, kflag = %i", kflag);

      if (kflag < 0) { break; }

      /* Perform relaxation:
           - computes relaxation parameter
           - on success, updates ycur, h, and dsm
           - on recoverable failure, updates eta and signals to retry step
           - on fatal error, returns negative error flag */
      if (ark_mem->relax_enabled && (kflag == ARK_SUCCESS))
      {
        kflag = arkRelax(ark_mem, &relax_fails, &dsm);

        SUNLogInfoIf(kflag != ARK_SUCCESS, ARK_LOGGER, "end-step-attempt",
                     "status = failed relaxtion, kflag = %i", kflag);

        if (kflag < 0) { break; }
      }

      /* perform constraint-handling (if selected, and if solver check passed) */
      if (ark_mem->constraintsSet && (kflag == ARK_SUCCESS))
      {
        kflag = arkCheckConstraints(ark_mem, &constrfails, &nflag);

        SUNLogInfoIf(kflag != ARK_SUCCESS, ARK_LOGGER, "end-step-attempt",
                     "status = failed constraints, kflag = %i", kflag);

        if (kflag < 0) { break; }
      }

      /* when fixed time-stepping is enabled, 'success' == successful stage solves
         (checked in previous block), so just enforce no step size change */
      if (ark_mem->fixedstep)
      {
        ark_mem->eta = ONE;
        SUNLogInfo(ARK_LOGGER, "end-step-attempt", "status = success");
        break;
      }

      /* check temporal error (if checks above passed) */
      if (kflag == ARK_SUCCESS)
      {
        kflag = arkCheckTemporalError(ark_mem, &nflag, &nef, dsm);

        SUNLogInfoIf(kflag != ARK_SUCCESS, ARK_LOGGER, "end-step-attempt",
                     "status = failed error test, dsm = " SUN_FORMAT_G
                     ", kflag = %i",
                     dsm, kflag);

        if (kflag < 0) { break; }
      }

      /* if ignoring temporal error test result (XBraid) force step to pass */
      if (ark_mem->force_pass)
      {
        ark_mem->last_kflag = kflag;
        kflag               = ARK_SUCCESS;
        SUNLogInfo(ARK_LOGGER, "end-step-attempt", "status = success");
        break;
      }

      /* break attempt loop on successful step */
      if (kflag == ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-step-attempt",
                   "status = success, dsm = " SUN_FORMAT_G, dsm);
        break;
      }

      /* unsuccessful step, if |h| = hmin, return ARK_ERR_FAILURE */
      if (SUNRabs(ark_mem->h) <= ark_mem->hmin * ONEPSM)
      {
        SUNDIALS_MARK_FUNCTION_END(ARK_PROFILER);
        return (ARK_ERR_FAILURE);
      }

      /* update h, hprime and next_h for next iteration */
      ark_mem->h *= ark_mem->eta;
      ark_mem->next_h = ark_mem->hprime = ark_mem->h;

    } /* end looping for step attempts */

    /* If step attempt loop succeeded, complete step (update current time, solution,
       error stepsize history arrays; call user-supplied step postprocessing function)
       (added stuff from arkStep_PrepareNextStep -- revisit) */
    if (kflag == ARK_SUCCESS) { kflag = arkCompleteStep(ark_mem, dsm); }

    /* If step attempt loop failed, process flag and return to user */
    if (kflag != ARK_SUCCESS)
    {
      istate            = arkHandleFailure(ark_mem, kflag);
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      break;
    }

    nstloc++;

    /* Check for root in last step taken. */
    if (ark_mem->root_mem != NULL)
    {
      if (ark_mem->root_mem->nrtfn > 0)
      {
        retval = arkRootCheck3((void*)ark_mem);
        if (retval == RTFOUND)
        { /* A new root was found */
          ark_mem->root_mem->irfnd = 1;
          istate                   = ARK_ROOT_RETURN;
          ark_mem->tretlast = *tret = ark_mem->root_mem->tlo;
          break;
        }
        else if (retval == ARK_RTFUNC_FAIL)
        { /* g failed */
          arkProcessError(ark_mem, ARK_RTFUNC_FAIL, __LINE__, __func__, __FILE__,
                          MSG_ARK_RTFUNC_FAILED, ark_mem->root_mem->tlo);
          istate = ARK_RTFUNC_FAIL;
          break;
        }

        /* If we are at the end of the first step and we still have
           some event functions that are inactive, issue a warning
           as this may indicate a user error in the implementation
           of the root function. */
        if (ark_mem->nst == 1)
        {
          inactive_roots = SUNFALSE;
          for (ir = 0; ir < ark_mem->root_mem->nrtfn; ir++)
          {
            if (!ark_mem->root_mem->gactive[ir])
            {
              inactive_roots = SUNTRUE;
              break;
            }
          }
          if ((ark_mem->root_mem->mxgnull > 0) && inactive_roots)
          {
            arkProcessError(ark_mem, ARK_WARNING, __LINE__, __func__, __FILE__,
                            MSG_ARK_INACTIVE_ROOTS);
          }
        }
      }
    }

    /* Check if tn is at tstop or near tstop */
    if (ark_mem->tstopset)
    {
      troundoff = FUZZ_FACTOR * ark_mem->uround *
                  (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h));

      if (SUNRabs(ark_mem->tcur - ark_mem->tstop) <= troundoff)
      {
        /* Ensure tout >= tstop, otherwise check for tout return below */
        if ((tout - ark_mem->tstop) * ark_mem->h >= ZERO ||
            SUNRabs(tout - ark_mem->tstop) <= troundoff)
        {
          if (ark_mem->tstopinterp && ark_mem->interp)
          {
            retval = ARKodeGetDky(ark_mem, ark_mem->tstop, 0, yout);
            if (retval != ARK_SUCCESS)
            {
              arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                              MSG_ARK_INTERPOLATION_FAIL, ark_mem->tstop);
              istate = retval;
              break;
            }
          }
          else { N_VScale(ONE, ark_mem->yn, yout); }
          ark_mem->tretlast = *tret = ark_mem->tstop;
          ark_mem->tstopset         = SUNFALSE;
          istate                    = ARK_TSTOP_RETURN;
          break;
        }
      }
      /* limit upcoming step if it will overcome tstop */
      else if ((ark_mem->tcur + ark_mem->hprime - ark_mem->tstop) * ark_mem->h >
               ZERO)
      {
        ark_mem->hprime = (ark_mem->tstop - ark_mem->tcur) *
                          (ONE - FOUR * ark_mem->uround);
        ark_mem->eta = ark_mem->hprime / ark_mem->h;
      }
    }

    /* In NORMAL mode, check if tout reached */
    if ((itask == ARK_NORMAL) && (ark_mem->tcur - tout) * ark_mem->h >= ZERO)
    {
      if (ark_mem->interp)
      {
        retval = ARKodeGetDky(ark_mem, tout, 0, yout);
        if (retval != ARK_SUCCESS)
        {
          arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                          MSG_ARK_INTERPOLATION_FAIL, tout);
          istate = retval;
          break;
        }
        ark_mem->tretlast = *tret = tout;
      }
      else
      {
        N_VScale(ONE, ark_mem->yn, yout);
        ark_mem->tretlast = *tret = ark_mem->tcur;
      }
      ark_mem->next_h = ark_mem->hprime;
      istate          = ARK_SUCCESS;
      break;
    }

    /* In ONE_STEP mode, copy y and exit loop */
    if (itask == ARK_ONE_STEP)
    {
      istate            = ARK_SUCCESS;
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      ark_mem->next_h = ark_mem->hprime;
      break;
    }

  } /* end looping for internal steps */

  /* stop profiler and return */
  SUNDIALS_MARK_FUNCTION_END(ARK_PROFILER);
  return (istate);
}